

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.hpp
# Opt level: O2

bool __thiscall
jsonrpccxx::JsonRpcServer::Add
          (JsonRpcServer *this,string *name,NotificationHandle *callback,NamedParamMapping *mapping)

{
  bool bVar1;
  long lVar2;
  function<void_(const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_&)>
  fStack_48;
  
  bVar1 = false;
  lVar2 = std::__cxx11::string::rfind((char *)name,0x16a01c);
  if (lVar2 != 0) {
    std::
    function<void_(const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_&)>
    ::function(&fStack_48,callback);
    bVar1 = Dispatcher::Add(&this->dispatcher,name,&fStack_48,mapping);
    std::_Function_base::~_Function_base(&fStack_48.super__Function_base);
  }
  return bVar1;
}

Assistant:

bool Add(const std::string &name, NotificationHandle callback, const NamedParamMapping &mapping = NAMED_PARAM_MAPPING) {
      if (name.rfind("rpc.", 0) == 0)
        return false;
      return dispatcher.Add(name, callback, mapping);
    }